

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_path * mg_path_copy_ca(mg_path *path,mg_allocator *allocator)

{
  mg_path *pmVar1;
  mg_node *pmVar2;
  mg_unbound_relationship *pmVar3;
  mg_allocator *in_RSI;
  uint *in_RDI;
  uint32_t i_3;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  mg_path *npath;
  void *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar5;
  undefined8 in_stack_fffffffffffffff8;
  
  pmVar1 = mg_path_alloc((uint32_t)((ulong)in_stack_fffffffffffffff8 >> 0x20),
                         (uint32_t)in_stack_fffffffffffffff8,(uint32_t)((ulong)in_RDI >> 0x20),
                         in_RSI);
  if (pmVar1 == (mg_path *)0x0) {
    pmVar1 = (mg_path *)0x0;
  }
  else {
    pmVar1->node_count = 0;
    for (uVar5 = 0; uVar5 < *in_RDI; uVar5 = uVar5 + 1) {
      pmVar2 = mg_node_copy_ca((mg_node *)CONCAT44(uVar5,in_stack_ffffffffffffffd8),
                               (mg_allocator *)
                               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      pmVar1->nodes[uVar5] = pmVar2;
      if (pmVar1->nodes[uVar5] == (mg_node *)0x0) goto LAB_0010efe3;
      pmVar1->node_count = pmVar1->node_count + 1;
    }
    pmVar1->relationship_count = 0;
    for (uVar4 = 0; uVar4 < in_RDI[1]; uVar4 = uVar4 + 1) {
      pmVar3 = mg_unbound_relationship_copy_ca
                         ((mg_unbound_relationship *)CONCAT44(uVar5,uVar4),
                          (mg_allocator *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      pmVar1->relationships[uVar4] = pmVar3;
      if (pmVar1->relationships[uVar4] == (mg_unbound_relationship *)0x0) {
LAB_0010efe3:
        for (uVar5 = 0; uVar5 < pmVar1->node_count; uVar5 = uVar5 + 1) {
          mg_node_destroy((mg_node *)0x10f00e);
        }
        for (uVar4 = 0; uVar4 < pmVar1->relationship_count; uVar4 = uVar4 + 1) {
          mg_unbound_relationship_destroy((mg_unbound_relationship *)0x10f047);
        }
        mg_allocator_free((mg_allocator *)CONCAT44(uVar5,uVar4),in_stack_ffffffffffffffc8);
        return (mg_path *)0x0;
      }
      pmVar1->relationship_count = pmVar1->relationship_count + 1;
    }
    pmVar1->sequence_length = in_RDI[2];
    memcpy(pmVar1->sequence,*(void **)(in_RDI + 8),(ulong)in_RDI[2] << 3);
  }
  return pmVar1;
}

Assistant:

mg_path *mg_path_copy_ca(const mg_path *path, mg_allocator *allocator) {
  mg_path *npath = mg_path_alloc(path->node_count, path->relationship_count,
                                 path->sequence_length, &mg_system_allocator);
  if (!npath) {
    return NULL;
  }
  npath->node_count = 0;
  for (uint32_t i = 0; i < path->node_count; ++i) {
    npath->nodes[i] = mg_node_copy_ca(path->nodes[i], allocator);
    if (!npath->nodes[i]) {
      goto cleanup;
    }
    npath->node_count++;
  }
  npath->relationship_count = 0;
  for (uint32_t i = 0; i < path->relationship_count; ++i) {
    npath->relationships[i] =
        mg_unbound_relationship_copy_ca(path->relationships[i], allocator);
    if (!npath->relationships[i]) {
      goto cleanup;
    }
    npath->relationship_count++;
  }
  npath->sequence_length = path->sequence_length;
  memcpy(npath->sequence, path->sequence,
         path->sequence_length * sizeof(int64_t));
  return npath;

cleanup:
  for (uint32_t i = 0; i < npath->node_count; ++i) {
    mg_node_destroy(npath->nodes[i]);
  }
  for (uint32_t i = 0; i < npath->relationship_count; ++i) {
    mg_unbound_relationship_destroy(npath->relationships[i]);
  }
  mg_allocator_free(&mg_system_allocator, npath);
  return NULL;
}